

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type pugi::impl::anon_unknown_0::utf8_writer::high(value_type result,uint32_t ch)

{
  uint32_t ch_local;
  value_type result_local;
  
  *result = (byte)(ch >> 0x12) | 0xf0;
  result[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
  result[2] = (byte)(ch >> 6) & 0x3f | 0x80;
  result[3] = (byte)ch & 0x3f | 0x80;
  return result + 4;
}

Assistant:

static value_type high(value_type result, uint32_t ch)
		{
			// U+10000..U+10FFFF
			result[0] = static_cast<uint8_t>(0xF0 | (ch >> 18));
			result[1] = static_cast<uint8_t>(0x80 | ((ch >> 12) & 0x3F));
			result[2] = static_cast<uint8_t>(0x80 | ((ch >> 6) & 0x3F));
			result[3] = static_cast<uint8_t>(0x80 | (ch & 0x3F));
			return result + 4;
		}